

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cc
# Opt level: O1

void lrit::to_json(json *j,ImageDataFunctionHeader *h)

{
  istringstream t;
  value_t vVar1;
  uint uVar2;
  int iVar3;
  json_value jVar4;
  float *__nptr;
  float *pfVar5;
  istream *piVar6;
  int *piVar7;
  ulong uVar8;
  undefined8 uVar9;
  reference pvVar10;
  float fVar11;
  string k;
  string v;
  json map;
  string str;
  string line;
  istringstream lss;
  istringstream iss;
  array<float,_256UL> table;
  float *local_7f0;
  json_value local_7e8;
  undefined1 local_7e0;
  undefined7 uStack_7df;
  float *local_7c0;
  json *local_7b8;
  value_t local_7b0;
  json_value local_7a8;
  float *local_7a0;
  long local_798;
  undefined1 local_790;
  undefined7 uStack_78f;
  undefined1 local_780 [8];
  json_value local_778;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_770;
  undefined1 *local_750;
  undefined8 local_748;
  undefined1 local_740;
  undefined7 uStack_73f;
  undefined1 local_730 [8];
  json_value local_728;
  ios_base local_6b8 [264];
  undefined1 local_5b0 [384];
  float local_430 [256];
  
  local_770._M_dataplus._M_p = (pointer)&local_770.field_2;
  local_7b8 = j;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_770,
             (h->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             (h->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish);
  local_780[0] = null;
  local_778.object = (object_t *)0x0;
  std::__cxx11::istringstream::istringstream((istringstream *)local_5b0,(string *)&local_770,_S_in);
  local_750 = &local_740;
  local_748 = 0;
  local_740 = 0;
  do {
    piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_5b0,(string *)&local_750,'\n');
    uVar2 = *(uint *)(&piVar6->field_0x20 + (long)piVar6->_vptr_basic_istream[-3]);
    if ((uVar2 & 5) != 0) {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)local_730,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)local_780);
      pvVar10 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                            *)local_7b8,"Map");
      t = (istringstream)pvVar10->m_type;
      pvVar10->m_type = (value_t)local_730[0];
      jVar4 = pvVar10->m_value;
      pvVar10->m_value = local_728;
      local_730[0] = t;
      local_728 = jVar4;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)(local_730 + 8),(value_t)t);
      local_7e8.object = (object_t *)0x0;
      local_7f0._0_1_ = (string)0x2;
      local_7a0 = local_430;
      local_7c0 = (float *)&stack0xffffffffffffffd0;
      local_7e8.object =
           (object_t *)
           nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::
           create<std::vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,float_const*,float_const*>
                     (&local_7a0,&local_7c0);
      pvVar10 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                            *)local_7b8,"Table");
      vVar1 = pvVar10->m_type;
      pvVar10->m_type = (value_t)local_7f0._0_1_;
      local_7f0 = (float *)CONCAT71(local_7f0._1_7_,vVar1);
      jVar4 = pvVar10->m_value;
      (pvVar10->m_value).object = (object_t *)local_7e8;
      local_7e8 = jVar4;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)&local_7e8.boolean,vVar1);
LAB_001199e3:
      if (local_750 != &local_740) {
        operator_delete(local_750,CONCAT71(uStack_73f,local_740) + 1);
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)local_5b0);
      std::ios_base::~ios_base((ios_base *)(local_5b0 + 0x78));
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)(local_780 + 8),local_780[0]);
      if ((uVar2 & 5) == 0) {
        local_7a8.object = (object_t *)0x0;
        local_7b0 = string;
        local_7a8.object =
             (object_t *)
             nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::create<std::__cxx11::string,std::__cxx11::string_const&>(&local_770);
        pvVar10 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                              *)local_7b8,"Original");
        vVar1 = pvVar10->m_type;
        pvVar10->m_type = local_7b0;
        jVar4 = pvVar10->m_value;
        (pvVar10->m_value).object = (object_t *)local_7a8;
        local_7b0 = vVar1;
        local_7a8 = jVar4;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)&local_7a8.boolean,vVar1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_770._M_dataplus._M_p != &local_770.field_2) {
        operator_delete(local_770._M_dataplus._M_p,local_770.field_2._M_allocated_capacity + 1);
      }
      return;
    }
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_730,(string *)&local_750,_S_in);
    local_7e8.object = (object_t *)0x0;
    local_7e0 = 0;
    local_798 = 0;
    local_790 = 0;
    local_7f0 = (float *)&local_7e0;
    local_7a0 = (float *)&local_790;
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_730,(string *)&local_7f0,'=');
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_730,(string *)&local_7a0,'\n');
    std::__cxx11::string::_M_erase((ulong)&local_7f0,local_7e8.number_integer - 1);
    __nptr = local_7f0;
    if ((local_7e8.object == (object_t *)0x0) || (local_798 == 0)) {
LAB_001198d1:
      if (local_7a0 != (float *)&local_790) {
        operator_delete(local_7a0,CONCAT71(uStack_78f,local_790) + 1);
      }
      if (local_7f0 != (float *)&local_7e0) {
        operator_delete(local_7f0,CONCAT71(uStack_7df,local_7e0) + 1);
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)local_730);
      std::ios_base::~ios_base((ios_base *)(local_730 + 0x78));
      goto LAB_001199e3;
    }
    piVar7 = __errno_location();
    iVar3 = *piVar7;
    *piVar7 = 0;
    uVar8 = strtol((char *)__nptr,(char **)&local_7c0,10);
    pfVar5 = local_7a0;
    if (local_7c0 == __nptr) {
      uVar9 = std::__throw_invalid_argument("stoi");
LAB_00119ad4:
      if (local_7a0 != (float *)&local_790) {
        operator_delete(local_7a0,CONCAT71(uStack_78f,local_790) + 1);
      }
      if (local_7f0 != (float *)&local_7e0) {
        operator_delete(local_7f0,CONCAT71(uStack_7df,local_7e0) + 1);
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)local_730);
      std::ios_base::~ios_base((ios_base *)(local_730 + 0x78));
      if (local_750 != &local_740) {
        operator_delete(local_750,CONCAT71(uStack_73f,local_740) + 1);
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)local_5b0);
      std::ios_base::~ios_base((ios_base *)(local_5b0 + 0x78));
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)(local_780 + 8),local_780[0]);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_770._M_dataplus._M_p != &local_770.field_2) {
        operator_delete(local_770._M_dataplus._M_p,local_770.field_2._M_allocated_capacity + 1);
      }
      _Unwind_Resume(uVar9);
    }
    if (((long)(int)uVar8 != uVar8) || (*piVar7 == 0x22)) {
      uVar9 = std::__throw_out_of_range("stoi");
      goto LAB_00119ad4;
    }
    if (*piVar7 == 0) {
      *piVar7 = iVar3;
    }
    iVar3 = *piVar7;
    *piVar7 = 0;
    fVar11 = strtof((char *)local_7a0,(char **)&local_7c0);
    if (local_7c0 == pfVar5) {
      uVar9 = std::__throw_invalid_argument("stof");
      goto LAB_00119ad4;
    }
    if (*piVar7 == 0) {
      *piVar7 = iVar3;
    }
    else if (*piVar7 == 0x22) {
      uVar9 = std::__throw_out_of_range("stof");
      goto LAB_00119ad4;
    }
    if ((uVar8 & 0xffffff00) != 0) goto LAB_001198d1;
    local_430[uVar8 & 0xff] = fVar11;
    if (local_7a0 != (float *)&local_790) {
      operator_delete(local_7a0,CONCAT71(uStack_78f,local_790) + 1);
    }
    if (local_7f0 != (float *)&local_7e0) {
      operator_delete(local_7f0,CONCAT71(uStack_7df,local_7e0) + 1);
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)local_730);
    std::ios_base::~ios_base((ios_base *)(local_730 + 0x78));
  } while( true );
}

Assistant:

void to_json(json& j, const ImageDataFunctionHeader& h) {
  const auto str = std::string((const char*)h.data.data(), h.data.size());
  if (!tryDecodeImageDataFunctionHeader(j, str)) {
    j["Original"] = str;
  }
}